

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  undefined1 *puVar1;
  ulong uVar2;
  secp256k1_ge *psVar3;
  uint32_t uVar4;
  uint uVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar6;
  int extraout_EAX_02;
  ulong uVar7;
  undefined4 in_register_0000000c;
  secp256k1_fe *extraout_RDX;
  secp256k1_fe *extraout_RDX_00;
  ulong uVar8;
  secp256k1_scalar *r;
  secp256k1_ge *unaff_RBX;
  secp256k1_ge *a_00;
  ulong unaff_RBP;
  secp256k1_ge *psVar9;
  undefined1 *puVar10;
  undefined4 in_register_00000034;
  ulong uVar11;
  secp256k1_fe *psVar12;
  secp256k1_ge *psVar13;
  ulong uVar14;
  secp256k1_fe *r_00;
  secp256k1_gej *in_R8;
  ulong unaff_R12;
  long lVar15;
  undefined1 *unaff_R13;
  uint uVar16;
  secp256k1_ge *unaff_R14;
  uint uVar17;
  secp256k1_ge *unaff_R15;
  secp256k1_fe *psVar18;
  bool bVar19;
  secp256k1_scalar s;
  secp256k1_fe sStack_318;
  secp256k1_fe sStack_2e0;
  secp256k1_fe sStack_2b0;
  secp256k1_ge *psStack_280;
  ulong uStack_278;
  undefined1 *puStack_270;
  secp256k1_ge *psStack_268;
  secp256k1_ge *psStack_260;
  code *pcStack_258;
  secp256k1_fe *psStack_248;
  secp256k1_gej sStack_240;
  secp256k1_gej sStack_1a8;
  secp256k1_ge sStack_110;
  secp256k1_ge *psStack_a8;
  ulong uStack_a0;
  undefined1 *puStack_98;
  secp256k1_ge *psStack_90;
  secp256k1_ge *psStack_88;
  code *pcStack_80;
  uint local_6c;
  int local_68;
  uint local_64;
  int *local_60;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  uint64_t uStack_40;
  
  a_00 = (secp256k1_ge *)CONCAT44(in_register_00000034,len);
  psVar12 = (secp256k1_fe *)CONCAT44(in_register_0000000c,w);
  local_60 = wnaf;
  if (wnaf == (int *)0x0) {
LAB_00147c99:
    pcStack_80 = (code *)0x147c9e;
    secp256k1_ecmult_wnaf_cold_5();
LAB_00147c9e:
    pcStack_80 = (code *)0x147ca3;
    secp256k1_ecmult_wnaf_cold_4();
  }
  else {
    unaff_R14 = (secp256k1_ge *)a;
    if (a == (secp256k1_scalar *)0x0) goto LAB_00147c9e;
    unaff_RBX = (secp256k1_ge *)(ulong)(uint)w;
    if (1 < w) {
      if (0 < len) {
        a_00 = (secp256k1_ge *)0x0;
        pcStack_80 = (code *)0x147b4b;
        memset(wnaf,0,(ulong)(uint)len << 2);
      }
      local_58 = a->d[0];
      uStack_50 = a->d[1];
      local_48 = a->d[2];
      uStack_40 = a->d[3];
      unaff_R14 = (secp256k1_ge *)&stack0xffffffffffffffa8;
      pcStack_80 = (code *)0x147b6a;
      wnaf = (int *)unaff_R14;
      secp256k1_scalar_verify((secp256k1_scalar *)unaff_R14);
      local_68 = 1;
      if ((long)uStack_40 < 0) {
        a_00 = (secp256k1_ge *)&stack0xffffffffffffffa8;
        pcStack_80 = (code *)0x147b86;
        wnaf = (int *)a_00;
        secp256k1_scalar_negate((secp256k1_scalar *)a_00,(secp256k1_scalar *)a_00);
        local_68 = -1;
      }
      if (len < 1) {
        bVar19 = true;
        unaff_R15 = (secp256k1_ge *)0x0;
        unaff_RBP = 0;
      }
      else {
        local_64 = w - 1;
        unaff_R12 = 0;
        local_6c = 0xffffffff;
        psVar9 = a_00;
        unaff_R14 = (secp256k1_ge *)0x0;
        do {
          a_00 = unaff_R14;
          wnaf = (int *)&stack0xffffffffffffffa8;
          pcStack_80 = (code *)0x147bb8;
          psVar13 = (secp256k1_ge *)wnaf;
          secp256k1_scalar_verify((secp256k1_scalar *)wnaf);
          uVar17 = (uint)a_00;
          bVar19 = (*(ulong *)((long)&stack0xffffffffffffffa8 + ((ulong)a_00 >> 6) * 8) >>
                    ((ulong)a_00 & 0x3f) & 1) != 0;
          psVar12 = (secp256k1_fe *)(ulong)bVar19;
          if ((uint)bVar19 == (uint)unaff_R12) {
            uVar16 = uVar17 + 1;
            a_00 = psVar9;
            wnaf = (int *)psVar13;
          }
          else {
            uVar16 = len - uVar17;
            if (w <= (int)(len - uVar17)) {
              uVar16 = w;
            }
            pcStack_80 = (code *)0x147bf4;
            uVar4 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)wnaf,uVar17,uVar16);
            uVar5 = uVar4 + (uint)unaff_R12;
            bVar19 = (uVar5 >> (local_64 & 0x1f) & 1) != 0;
            unaff_R12 = (ulong)bVar19;
            psVar12 = (secp256k1_fe *)(long)(int)uVar17;
            local_60[(long)psVar12] = (uVar5 - ((uint)bVar19 << ((byte)w & 0x1f))) * local_68;
            uVar16 = uVar16 + uVar17;
            local_6c = uVar17;
          }
          unaff_R14 = (secp256k1_ge *)(ulong)uVar16;
          unaff_R13 = (undefined1 *)&stack0xffffffffffffffa8;
          psVar9 = a_00;
        } while ((int)uVar16 < len);
        bVar19 = (int)unaff_R12 == 0;
        unaff_RBP = (ulong)(local_6c + 1);
        unaff_R15 = unaff_R14;
      }
      if (bVar19) {
        if ((int)unaff_R15 < 0x100) {
          unaff_RBX = (secp256k1_ge *)&stack0xffffffffffffffa8;
          do {
            pcStack_80 = (code *)0x147c66;
            wnaf = (int *)unaff_RBX;
            secp256k1_scalar_verify((secp256k1_scalar *)unaff_RBX);
            if ((*(ulong *)((long)&stack0xffffffffffffffa8 + ((ulong)unaff_R15 >> 6) * 8) >>
                 ((ulong)unaff_R15 & 0x3f) & 1) != 0) {
              pcStack_80 = (code *)0x147c99;
              secp256k1_ecmult_wnaf_cold_2();
              goto LAB_00147c99;
            }
            uVar17 = (int)unaff_R15 + 1;
            unaff_R15 = (secp256k1_ge *)(ulong)uVar17;
          } while (uVar17 != 0x100);
        }
        return (int)unaff_RBP;
      }
      goto LAB_00147ca8;
    }
  }
  pcStack_80 = (code *)0x147ca8;
  secp256k1_ecmult_wnaf_cold_3();
LAB_00147ca8:
  pcStack_80 = secp256k1_ecmult_odd_multiples_table;
  secp256k1_ecmult_wnaf_cold_1();
  psStack_a8 = unaff_RBX;
  uStack_a0 = unaff_R12;
  puStack_98 = unaff_R13;
  psStack_90 = unaff_R14;
  psStack_88 = unaff_R15;
  pcStack_80 = (code *)unaff_RBP;
  if (in_R8->infinity == 0) {
    pcStack_258 = (code *)0x147cf1;
    psStack_248 = psVar12;
    secp256k1_gej_double_var(&sStack_1a8,in_R8,(secp256k1_fe *)0x0);
    pcStack_258 = (code *)0x147d09;
    secp256k1_ge_set_xy(&sStack_110,&sStack_1a8.x,&sStack_1a8.y);
    pcStack_258 = (code *)0x147d1f;
    secp256k1_ge_set_gej_zinv(a_00,in_R8,&sStack_1a8.z);
    pcStack_258 = (code *)0x147d2c;
    secp256k1_gej_set_ge(&sStack_240,a_00);
    sStack_240.z.n[0] = (in_R8->z).n[0];
    sStack_240.z.n[1] = (in_R8->z).n[1];
    sStack_240.z.n[2] = (in_R8->z).n[2];
    sStack_240.z.n[3] = (in_R8->z).n[3];
    sStack_240.z.n[4] = (in_R8->z).n[4];
    sStack_240.z.magnitude = (in_R8->z).magnitude;
    sStack_240.z.normalized = (in_R8->z).normalized;
    extraout_RDX->n[4] = sStack_1a8.z.n[4];
    extraout_RDX->magnitude = sStack_1a8.z.magnitude;
    extraout_RDX->normalized = sStack_1a8.z.normalized;
    extraout_RDX->n[2] = sStack_1a8.z.n[2];
    extraout_RDX->n[3] = sStack_1a8.z.n[3];
    extraout_RDX->n[0] = sStack_1a8.z.n[0];
    extraout_RDX->n[1] = sStack_1a8.z.n[1];
    if (1 < (int)wnaf) {
      lVar15 = ((ulong)wnaf & 0xffffffff) - 1;
      psVar12 = extraout_RDX;
      do {
        a_00 = a_00 + 1;
        psVar12 = psVar12 + 1;
        pcStack_258 = (code *)0x147da0;
        secp256k1_gej_add_ge_var(&sStack_240,&sStack_240,&sStack_110,psVar12);
        pcStack_258 = (code *)0x147dae;
        secp256k1_ge_set_xy(a_00,&sStack_240.x,&sStack_240.y);
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    pcStack_258 = (code *)0x147dd2;
    secp256k1_fe_mul(psStack_248,&sStack_240.z,&sStack_1a8.z);
    return extraout_EAX;
  }
  pcStack_258 = secp256k1_ge_table_set_globalz;
  secp256k1_ecmult_odd_multiples_table_cold_1();
  psVar9 = (secp256k1_ge *)wnaf;
  psVar13 = a_00;
  psVar12 = extraout_RDX_00;
  iVar6 = extraout_EAX_00;
  psStack_280 = unaff_RBX;
  uStack_278 = unaff_R12;
  puStack_270 = unaff_R13;
  psStack_268 = unaff_R14;
  psStack_260 = unaff_R15;
  pcStack_258 = (code *)unaff_RBP;
  if ((secp256k1_ge *)wnaf != (secp256k1_ge *)0x0) {
    do {
      secp256k1_ge_verify(psVar13);
      secp256k1_fe_verify(psVar12);
      psVar12 = psVar12 + 1;
      psVar3 = psVar9 + -1;
      psVar9 = (secp256k1_ge *)&psVar3->field_0x67;
      psVar13 = psVar13 + 1;
    } while (&psVar3->field_0x67 != (undefined1 *)0x0);
    puVar1 = &((secp256k1_ge *)((long)wnaf + -0x68))->field_0x67;
    psVar18 = &a_00[(long)puVar1].y;
    secp256k1_fe_verify(psVar18);
    uVar2 = a_00[(long)puVar1].y.n[4];
    uVar8 = (uVar2 >> 0x30) * 0x1000003d1 + psVar18->n[0];
    uVar7 = (uVar8 >> 0x34) + a_00[(long)puVar1].y.n[1];
    uVar11 = (uVar7 >> 0x34) + a_00[(long)puVar1].y.n[2];
    uVar14 = (uVar11 >> 0x34) + a_00[(long)puVar1].y.n[3];
    psVar12 = (secp256k1_fe *)(uVar11 & 0xfffffffffffff);
    psVar18->n[0] = uVar8 & 0xfffffffffffff;
    a_00[(long)puVar1].y.n[1] = uVar7 & 0xfffffffffffff;
    a_00[(long)puVar1].y.n[2] = (uint64_t)psVar12;
    a_00[(long)puVar1].y.n[3] = uVar14 & 0xfffffffffffff;
    a_00[(long)puVar1].y.n[4] = (uVar14 >> 0x34) + (uVar2 & 0xffffffffffff);
    a_00[(long)puVar1].y.magnitude = 1;
    secp256k1_fe_verify(psVar18);
    sStack_318.n[0] = extraout_RDX_00[(long)puVar1].n[0];
    sStack_318.n[1] = extraout_RDX_00[(long)puVar1].n[1];
    sStack_318.n[2] = extraout_RDX_00[(long)puVar1].n[2];
    sStack_318.n[3] = (extraout_RDX_00[(long)puVar1].n + 2)[1];
    sStack_318.n[4] = extraout_RDX_00[(long)puVar1].n[4];
    sStack_318._40_8_ = (extraout_RDX_00[(long)puVar1].n + 4)[1];
    if (puVar1 != (undefined1 *)0x0) {
      psVar9 = a_00 + (long)&((secp256k1_ge *)((long)wnaf + -0x68))->field_0x66;
      psVar18 = extraout_RDX_00 + (long)wnaf;
      puVar10 = (undefined1 *)0x0;
      do {
        psVar18 = psVar18 + -1;
        if (puVar10 != (undefined1 *)0x0) {
          psVar12 = &sStack_318;
          secp256k1_fe_mul(&sStack_318,&sStack_318,psVar18);
        }
        secp256k1_ge_verify(psVar9);
        r_00 = &sStack_318;
        secp256k1_fe_verify(&sStack_318);
        if (psVar9->infinity != 0) {
          secp256k1_ge_table_set_globalz_cold_1();
          secp256k1_scalar_verify(r);
          r_00->n[0] = r->d[0];
          r_00->n[1] = r->d[1];
          r_00->n[2] = 0;
          r_00->n[3] = 0;
          psVar12->n[0] = r->d[2];
          psVar12->n[1] = r->d[3];
          psVar12->n[2] = 0;
          psVar12->n[3] = 0;
          secp256k1_scalar_verify((secp256k1_scalar *)r_00);
          secp256k1_scalar_verify((secp256k1_scalar *)psVar12);
          return extraout_EAX_02;
        }
        secp256k1_fe_sqr(&sStack_2b0,&sStack_318);
        secp256k1_fe_mul(&sStack_2e0,&sStack_2b0,&sStack_318);
        secp256k1_fe_mul(&psVar9->x,&psVar9->x,&sStack_2b0);
        psVar12 = &psVar9->y;
        secp256k1_fe_mul(psVar12,psVar12,&sStack_2e0);
        secp256k1_ge_verify(psVar9);
        puVar10 = puVar10 + 1;
        psVar9 = psVar9 + -1;
      } while (puVar1 != puVar10);
    }
    do {
      secp256k1_ge_verify(a_00);
      a_00 = a_00 + 1;
      wnaf = (int *)&((secp256k1_ge *)((long)wnaf + -0x68))->field_0x67;
      iVar6 = extraout_EAX_01;
    } while (wnaf != (int *)0x0);
  }
  return iVar6;
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    for (bit = 0; bit < len; bit++) {
        wnaf[bit] = 0;
    }

    s = *a;
    if (secp256k1_scalar_get_bits_limb32(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    bit = 0;
    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits_limb32(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}